

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

bool __thiscall Minisat::BoolOption::parse(BoolOption *this,char *str)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  char *span;
  char *__s1;
  bool bVar6;
  
  if (*str != '-') {
    return false;
  }
  uVar4 = (ulong)(*str == '-');
  __s1 = str + uVar4;
  bVar6 = true;
  if (*__s1 == 'n') {
    lVar5 = 0;
    do {
      if (lVar5 == 2) {
        __s1 = __s1 + 3;
        bVar6 = false;
        goto LAB_00106c19;
      }
      lVar2 = lVar5 + 1;
      lVar1 = lVar5 + uVar4 + 1;
      lVar5 = lVar5 + 1;
    } while (str[lVar1] == "no-"[lVar2]);
    bVar6 = "no-"[lVar2] != '\0';
  }
LAB_00106c19:
  iVar3 = strcmp(__s1,(this->super_Option).name);
  if (iVar3 == 0) {
    this->value = bVar6;
  }
  return iVar3 == 0;
}

Assistant:

static bool match(B& in, const char* str) {
    int i;
    for (i = 0; str[i] != '\0'; i++)
        if (in[i] != str[i])
            return false;

    in += i;

    return true; 
}